

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool>
               (string_t *ldata,date_t *rdata,timestamp_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  timestamp_t tVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  ulong uVar11;
  idx_t idx_in_entry;
  ulong uVar12;
  string_t specifier;
  string_t specifier_00;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  date_t *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      uVar12 = 0;
      do {
        uVar8 = uVar12;
        if (psVar2 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar2[uVar12];
        }
        uVar11 = uVar12;
        if (psVar3 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar3[uVar12];
        }
        specifier.value._8_4_ = rdata[uVar11].days;
        specifier.value._0_8_ = ldata[uVar8].value.pointer.ptr;
        specifier.value._12_4_ = 0;
        tVar9 = DateTruncBinaryOperator::
                Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                          (*(DateTruncBinaryOperator **)&ldata[uVar8].value,specifier,
                           (date_t)(int32_t)uVar11);
        result_data[uVar12].value = tVar9.value;
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
    }
  }
  else if (count != 0) {
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar12 = 0;
    local_40 = rdata;
    do {
      uVar8 = uVar12;
      if (psVar2 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar2[uVar12];
      }
      uVar11 = uVar12;
      if (psVar3 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar3[uVar12];
      }
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) &&
         ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)))) {
        specifier_00.value._8_4_ = rdata[uVar11].days;
        specifier_00.value._0_8_ = ldata[uVar8].value.pointer.ptr;
        specifier_00.value._12_4_ = 0;
        tVar9 = DateTruncBinaryOperator::
                Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                          (*(DateTruncBinaryOperator **)&ldata[uVar8].value,specifier_00,
                           (date_t)(int32_t)uVar11);
        result_data[uVar12].value = tVar9.value;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var7 = p_Stack_50;
          peVar6 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar6;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_48);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          rdata = local_40;
        }
        bVar5 = (byte)uVar12 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar12 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}